

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

json __thiscall
helics::BaseTimeCoordinator::grantTimeoutCheck_abi_cxx11_
          (BaseTimeCoordinator *this,ActionMessage *cmd)

{
  bool bVar1;
  reference pDVar2;
  long in_RDX;
  json_value extraout_RDX;
  json_value jVar3;
  long *in_RSI;
  TimeDependencies *in_RDI;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  bVar4;
  json jVar5;
  DependencyInfo *dep;
  iterator __end1;
  iterator __begin1;
  TimeDependencies *__range1;
  json *base;
  TimeDependencies *this_00;
  initializer_list_t in_stack_ffffffffffffffa0;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_28;
  long *local_20;
  long local_18;
  
  local_20 = in_RSI + 1;
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_28._M_current = (DependencyInfo *)TimeDependencies::begin(in_RDI);
  TimeDependencies::end(in_RDI);
  do {
    bVar1 = __gnu_cxx::
            operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)this_00,
                       (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      CLI::std::
      initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::initializer_list((initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          *)&stack0xffffffffffffffa0);
      bVar4 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::object(in_stack_ffffffffffffffa0);
      jVar3 = bVar4.m_data.m_value;
LAB_00631704:
      jVar5.m_data.m_value.string = jVar3.string;
      jVar5.m_data._0_8_ = this_00;
      return (json)jVar5.m_data;
    }
    pDVar2 = __gnu_cxx::
             __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator*(&local_28);
    bVar1 = GlobalFederateId::operator==
                      (&pDVar2->fedID,(GlobalFederateId)*(BaseType *)(local_18 + 8));
    if ((bVar1) &&
       ((pDVar2->super_TimeData).timeoutCount = (uint)*(ushort *)(local_18 + 0x18),
       *(short *)(local_18 + 0x18) == 6)) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)this_00,in_RDI);
      (**(code **)(*in_RSI + 0x60))(in_RSI,in_RDI);
      jVar3 = extraout_RDX;
      goto LAB_00631704;
    }
    __gnu_cxx::
    __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

nlohmann::json BaseTimeCoordinator::grantTimeoutCheck(const ActionMessage& cmd)
{
    for (auto& dep : dependencies) {
        if (dep.fedID == cmd.source_id) {
            dep.timeoutCount = cmd.counter;
            if (cmd.counter == 6) {
                nlohmann::json base;
                generateDebuggingTimeInfo(base);
                return base;
            }
        }
    }
    return nlohmann::json::object();
}